

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

int scmp(uchar *s1,uchar *s2)

{
  bool bVar1;
  byte *local_18;
  uchar *s2_local;
  uchar *s1_local;
  
  local_18 = s2;
  s2_local = s1;
  while( true ) {
    bVar1 = false;
    if (*s2_local != '\0') {
      bVar1 = *s2_local == *local_18;
    }
    if (!bVar1) break;
    s2_local = s2_local + 1;
    local_18 = local_18 + 1;
  }
  return (uint)*s2_local - (uint)*local_18;
}

Assistant:

int scmp( unsigned char *s1, unsigned char *s2 )
{
    while( *s1 != '\0' && *s1 == *s2 )
    {
        s1++;
        s2++;
    }
    return( *s1-*s2 );
}